

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.cpp
# Opt level: O0

void __thiscall cube::http::HTTPClient::~HTTPClient(HTTPClient *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  element_type *this_00;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>
  local_28;
  _Self local_20;
  _Self local_18;
  iterator it;
  HTTPClient *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>_>
       ::begin(&this->m_idle_conns);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>_>
         ::end(&this->m_idle_conns);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    while( true ) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>
               ::operator->(&local_18);
      bVar1 = std::
              map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>
              ::empty(&ppVar2->second);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>
               ::operator->(&local_18);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>
           ::begin(&ppVar2->second);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>
               ::operator->(&local_28);
      this_00 = std::
                __shared_ptr_access<cube::http::HTTPClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cube::http::HTTPClientConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar3->second);
      HTTPClientConnection::Close(this_00);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>
    ::operator++(&local_18,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>_>
  ::clear(&this->m_idle_conns);
  bVar1 = std::
          map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>
          ::empty(&this->m_requesting_conns);
  if (bVar1) {
    std::
    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~map(&this->m_timeouts);
    std::
    map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>
    ::~map(&this->m_requesting_conns);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cube::http::HTTPClientConnection>_>_>_>_>_>_>
    ::~map(&this->m_idle_conns);
    return;
  }
  __assert_fail("m_requesting_conns.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/http/http_client.cpp"
                ,0x1e,"cube::http::HTTPClient::~HTTPClient()");
}

Assistant:

HTTPClient::~HTTPClient() {
    // close all connections
    //auto idle_conns = std::move(m_idle_conns);
    for (auto it = m_idle_conns.begin(); it != m_idle_conns.end(); it++) {
        while (!it->second.empty()) {
            it->second.begin()->second->Close();
        }
    }
    m_idle_conns.clear();

    assert(m_requesting_conns.empty());
}